

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  tm *stm;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char cc [4];
  time_t t;
  size_t slen;
  luaL_Buffer b;
  char local_207c;
  undefined1 local_207b [3];
  lua_Integer local_2078;
  tm *local_2070;
  char *local_2068;
  char *local_2060;
  size_t local_2058;
  luaL_Buffer local_2050;
  
  __s1 = luaL_optlstring(L,1,"%c",&local_2058);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    local_2078 = time((time_t *)0x0);
  }
  else {
    local_2078 = luaL_checkinteger(L,2);
  }
  pcVar6 = __s1 + local_2058;
  if (*__s1 == '!') {
    stm = (tm *)gmtime(&local_2078);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime(&local_2078);
  }
  if (stm == (tm *)0x0) {
    luaL_error(L,"time result cannot be represented in this installation");
  }
  if (((*__s1 == '*') && (__s1[1] == 't')) && (__s1[2] == '\0')) {
    lua_createtable(L,0,9);
    setallfields(L,stm);
  }
  else {
    local_207c = '%';
    luaL_buffinit(L,&local_2050);
    pcVar5 = pcVar6;
    if (__s1 < pcVar6) {
      do {
        local_2068 = pcVar5;
        local_2070 = stm;
        cVar1 = *__s1;
        if (cVar1 == '%') {
          local_2060 = luaL_prepbuffsize(&local_2050,0xfa);
          __s1 = __s1 + 1;
          if (0 < (long)pcVar6 - (long)__s1) {
            iVar2 = 1;
            cVar1 = 'a';
            sVar4 = 1;
            pcVar5 = "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy"
            ;
            do {
              if (cVar1 == '|') {
                iVar2 = iVar2 + 1;
              }
              else {
                iVar3 = bcmp(__s1,pcVar5,sVar4);
                if (iVar3 == 0) {
                  memcpy(local_207b,__s1,sVar4);
                  local_207b[sVar4] = 0;
                  __s1 = __s1 + sVar4;
                  goto LAB_00112947;
                }
              }
              sVar4 = (size_t)iVar2;
              cVar1 = pcVar5[sVar4];
            } while ((cVar1 != '\0') &&
                    (pcVar5 = pcVar5 + sVar4, (long)sVar4 <= (long)pcVar6 - (long)__s1));
          }
          pcVar6 = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",__s1);
          luaL_argerror(L,1,pcVar6);
LAB_00112947:
          sVar4 = strftime(local_2060,0xfa,&local_207c,(tm *)local_2070);
          pcVar6 = local_2068;
          local_2050.n = local_2050.n + sVar4;
        }
        else {
          if (local_2050.size <= local_2050.n) {
            luaL_prepbuffsize(&local_2050,1);
            cVar1 = *__s1;
          }
          __s1 = __s1 + 1;
          local_2050.b[local_2050.n] = cVar1;
          local_2050.n = local_2050.n + 1;
        }
        stm = local_2070;
        pcVar5 = local_2068;
      } while (__s1 < pcVar6);
    }
    luaL_pushresult(&local_2050);
  }
  return 1;
}

Assistant:

static int os_date(lua_State *L) {
    size_t slen;
    const char *s = luaL_optlstring(L, 1, "%c", &slen);
    time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
    const char *se = s + slen;  /* 's' end */
    struct tm tmr, *stm;
    if (*s == '!') {  /* UTC? */
        stm = l_gmtime(&t, &tmr);
        s++;  /* skip '!' */
    } else
        stm = l_localtime(&t, &tmr);
    if (stm == NULL)  /* invalid date? */
        luaL_error(L, "time result cannot be represented in this installation");
    if (strcmp(s, "*t") == 0) {
        lua_createtable(L, 0, 9);  /* 9 = number of fields */
        setallfields(L, stm);
    } else {
        char cc[4];  /* buffer for individual conversion specifiers */
        luaL_Buffer b;
        cc[0] = '%';
        luaL_buffinit(L, &b);
        while (s < se) {
            if (*s != '%')  /* not a conversion specifier? */
                luaL_addchar(&b, *s++);
            else {
                size_t reslen;
                char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
                s++;  /* skip '%' */
                s = checkoption(L, s, se - s, cc + 1);  /* copy specifier to 'cc' */
                reslen = strftime(buff, SIZETIMEFMT, cc, stm);
                luaL_addsize(&b, reslen);
            }
        }
        luaL_pushresult(&b);
    }
    return 1;
}